

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_flac__init_private__native
                    (ma_dr_flac_init_info *pInit,ma_dr_flac_read_proc onRead,
                    ma_dr_flac_seek_proc onSeek,ma_dr_flac_meta_proc onMeta,void *pUserData,
                    void *pUserDataMD,ma_bool32 relaxed)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ma_bool32 mVar4;
  long lVar5;
  code *in_RCX;
  code *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  ma_dr_flac_metadata metadata;
  ma_dr_flac_streaminfo streaminfo;
  ma_uint32 blockSize;
  ma_uint8 blockType;
  ma_uint8 isLastBlock;
  ma_uint8 lookup [11];
  ma_uint32 blockHeader;
  undefined4 local_188 [2];
  undefined8 local_180;
  undefined4 local_178;
  undefined1 auStackY_170 [8];
  ma_dr_flac_streaminfo *in_stack_fffffffffffffe98;
  void *in_stack_fffffffffffffea0;
  ma_dr_flac_read_proc in_stack_fffffffffffffea8;
  undefined1 local_d8 [2];
  undefined2 local_d6;
  undefined4 local_cc;
  undefined1 local_c8;
  undefined1 local_c7;
  undefined8 local_c0;
  uint local_a8;
  char local_a2;
  byte local_a1;
  undefined8 local_a0;
  code *local_90;
  long local_78;
  ma_bool32 local_6c;
  undefined8 local_68;
  undefined2 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa2;
  undefined1 in_stack_ffffffffffffffa3;
  uint in_stack_ffffffffffffffa4;
  uint *puVar6;
  uint *puVar7;
  ma_dr_flac_bs *bs;
  ma_uint8 streaminfoBitsPerSample;
  
  *(undefined4 *)(in_RDI + 0x18) = 0;
  bs = (ma_dr_flac_bs *)&stack0xffffffffffffff5e;
  puVar6 = &local_a8;
  local_a8 = 0;
  local_a0 = in_R9;
  local_90 = in_RCX;
  local_78 = in_RDI;
  lVar5 = (*in_RSI)(in_R8,&stack0xffffffffffffffa4,4);
  if (lVar5 == 4) {
    uVar1 = in_stack_ffffffffffffffa4 >> 0x18;
    uVar2 = in_stack_ffffffffffffffa4 & 0xff0000;
    uVar3 = in_stack_ffffffffffffffa4 & 0xff00;
    local_a1 = (byte)in_stack_ffffffffffffffa4 >> 7;
    puVar7 = puVar6;
    *(byte *)&bs->onRead = (byte)in_stack_ffffffffffffffa4 & 0x7f;
    streaminfoBitsPerSample = (ma_uint8)((ulong)puVar7 >> 0x38);
    *puVar6 = uVar1 | uVar2 >> 8 | uVar3 << 8;
    if ((local_a2 == '\0') && (local_a8 == 0x22)) {
      mVar4 = ma_dr_flac__read_streaminfo
                        (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                         in_stack_fffffffffffffe98);
      if (mVar4 == 0) {
        local_6c = 0;
      }
      else {
        *(undefined4 *)(local_78 + 0x50) = 1;
        *(undefined4 *)(local_78 + 0x30) = local_cc;
        *(undefined1 *)(local_78 + 0x34) = local_c8;
        *(undefined1 *)(local_78 + 0x35) = local_c7;
        *(undefined8 *)(local_78 + 0x38) = local_c0;
        *(undefined2 *)(local_78 + 0x40) = local_d6;
        *(uint *)(local_78 + 0x54) = (uint)((local_a1 != 0 ^ 0xffU) & 1);
        if (local_90 != (code *)0x0) {
          local_188[0] = 0;
          local_180 = 0;
          local_178 = 0;
          memcpy(auStackY_170,local_d8,0x30);
          (*local_90)(local_a0,local_188);
        }
        local_6c = 1;
      }
    }
    else if ((int)metadata.pRawData == 0) {
      local_6c = 0;
    }
    else {
      *(undefined4 *)(local_78 + 0x50) = 0;
      *(undefined4 *)(local_78 + 0x54) = 0;
      mVar4 = ma_dr_flac__read_next_flac_frame_header
                        (bs,streaminfoBitsPerSample,
                         (ma_dr_flac_frame_header *)
                         CONCAT44(in_stack_ffffffffffffffa4,
                                  CONCAT13(in_stack_ffffffffffffffa3,
                                           CONCAT12(in_stack_ffffffffffffffa2,
                                                    in_stack_ffffffffffffffa0))));
      if (mVar4 == 0) {
        local_6c = 0;
      }
      else if (*(char *)(local_78 + 0x10bb) == '\0') {
        local_6c = 0;
      }
      else {
        *(undefined4 *)(local_78 + 0x30) = *(undefined4 *)(local_78 + 0x10b4);
        local_68 = 0x807060504030201;
        *(undefined1 *)(local_78 + 0x34) =
             *(undefined1 *)((long)&stack0xffffffffffffff98 + (long)*(char *)(local_78 + 0x10ba));
        *(undefined1 *)(local_78 + 0x35) = *(undefined1 *)(local_78 + 0x10bb);
        *(undefined2 *)(local_78 + 0x40) = 0xffff;
        local_6c = 1;
      }
    }
  }
  else {
    local_6c = 0;
  }
  return local_6c;
}

Assistant:

static ma_bool32 ma_dr_flac__init_private__native(ma_dr_flac_init_info* pInit, ma_dr_flac_read_proc onRead, ma_dr_flac_seek_proc onSeek, ma_dr_flac_meta_proc onMeta, void* pUserData, void* pUserDataMD, ma_bool32 relaxed)
{
    ma_uint8 isLastBlock;
    ma_uint8 blockType;
    ma_uint32 blockSize;
    (void)onSeek;
    pInit->container = ma_dr_flac_container_native;
    if (!ma_dr_flac__read_and_decode_block_header(onRead, pUserData, &isLastBlock, &blockType, &blockSize)) {
        return MA_FALSE;
    }
    if (blockType != MA_DR_FLAC_METADATA_BLOCK_TYPE_STREAMINFO || blockSize != 34) {
        if (!relaxed) {
            return MA_FALSE;
        } else {
            pInit->hasStreamInfoBlock = MA_FALSE;
            pInit->hasMetadataBlocks  = MA_FALSE;
            if (!ma_dr_flac__read_next_flac_frame_header(&pInit->bs, 0, &pInit->firstFrameHeader)) {
                return MA_FALSE;
            }
            if (pInit->firstFrameHeader.bitsPerSample == 0) {
                return MA_FALSE;
            }
            pInit->sampleRate              = pInit->firstFrameHeader.sampleRate;
            pInit->channels                = ma_dr_flac__get_channel_count_from_channel_assignment(pInit->firstFrameHeader.channelAssignment);
            pInit->bitsPerSample           = pInit->firstFrameHeader.bitsPerSample;
            pInit->maxBlockSizeInPCMFrames = 65535;
            return MA_TRUE;
        }
    } else {
        ma_dr_flac_streaminfo streaminfo;
        if (!ma_dr_flac__read_streaminfo(onRead, pUserData, &streaminfo)) {
            return MA_FALSE;
        }
        pInit->hasStreamInfoBlock      = MA_TRUE;
        pInit->sampleRate              = streaminfo.sampleRate;
        pInit->channels                = streaminfo.channels;
        pInit->bitsPerSample           = streaminfo.bitsPerSample;
        pInit->totalPCMFrameCount      = streaminfo.totalPCMFrameCount;
        pInit->maxBlockSizeInPCMFrames = streaminfo.maxBlockSizeInPCMFrames;
        pInit->hasMetadataBlocks       = !isLastBlock;
        if (onMeta) {
            ma_dr_flac_metadata metadata;
            metadata.type = MA_DR_FLAC_METADATA_BLOCK_TYPE_STREAMINFO;
            metadata.pRawData = NULL;
            metadata.rawDataSize = 0;
            metadata.data.streaminfo = streaminfo;
            onMeta(pUserDataMD, &metadata);
        }
        return MA_TRUE;
    }
}